

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O2

void __thiscall Linker::Linker(Linker *this)

{
  EVP_PKEY_CTX *ctx;
  
  FastVector<ExternTypeInfo,_false,_false>::FastVector(&this->exTypes,0x80);
  FastVector<ExternMemberInfo,_false,_false>::FastVector(&this->exTypeExtra,0x100);
  FastVector<ExternConstantInfo,_false,_false>::FastVector(&this->exTypeConstants,0x100);
  FastVector<ExternVarInfo,_false,_false>::FastVector(&this->exVariables,0x80);
  FastVector<ExternFuncInfo,_false,_false>::FastVector(&this->exFunctions,0x100);
  (this->exFunctionExplicitTypes).data = (uint *)0x0;
  (this->exFunctionExplicitTypes).max = 0;
  (this->exFunctionExplicitTypes).count = 0;
  (this->exFunctionExplicitTypeArrayOffsets).data = (uint *)0x0;
  (this->exFunctionExplicitTypeArrayOffsets).max = 0;
  (this->exFunctionExplicitTypeArrayOffsets).count = 0;
  FastVector<ExternLocalInfo,_false,_false>::FastVector(&this->exLocals,0x400);
  (this->exModules).data = (ExternModuleInfo *)0x0;
  (this->exModules).max = 0;
  (this->exModules).count = 0;
  FastVector<char,_false,_false>::FastVector(&this->exSymbols,0x2000);
  (this->exRegVmExecCount).data = (uint *)0x0;
  (this->exRegVmExecCount).max = 0;
  (this->exRegVmExecCount).count = 0;
  (this->exRegVmSourceInfo).data = (ExternSourceInfo *)0x0;
  (this->exRegVmSourceInfo).max = 0;
  (this->exRegVmSourceInfo).count = 0;
  (this->exRegVmCode).data = (RegVmCmd *)0x0;
  (this->exRegVmCode).max = 0;
  (this->exRegVmCode).count = 0;
  (this->exMainModuleName).data = (char *)0x0;
  (this->exMainModuleName).max = 0;
  (this->exMainModuleName).count = 0;
  (this->exImportPaths).data = (char *)0x0;
  (this->exImportPaths).max = 0;
  (this->exImportPaths).count = 0;
  (this->exSource).data = (char *)0x0;
  (this->exSource).max = 0;
  (this->exSource).count = 0;
  (this->exRegVmConstants).data = (uint *)0x0;
  (this->exRegVmConstants).max = 0;
  (this->exRegVmConstants).count = 0;
  (this->exRegVmRegKillInfo).data = (uchar *)0x0;
  (this->exRegVmRegKillInfo).max = 0;
  (this->exRegVmRegKillInfo).count = 0;
  ctx = (EVP_PKEY_CTX *)0x400;
  FastVector<unsigned_int,_false,_false>::FastVector(&this->regVmJumpTargets,0x400);
  (this->expiredRegVmConstants).data = (uint **)0x0;
  (this->expiredRegVmConstants).max = 0;
  (this->expiredRegVmConstants).count = 0;
  (this->expiredRegVmCode).data = (RegVmCmd **)0x0;
  (this->expiredRegVmCode).max = 0;
  (this->expiredRegVmCode).count = 0;
  (this->typeRemap).data = (uint *)0x0;
  (this->typeRemap).max = 0;
  (this->typeRemap).count = 0;
  (this->funcRemap).data = (uint *)0x0;
  (this->funcRemap).max = 0;
  (this->funcRemap).count = 0;
  (this->moduleRemap).data = (uint *)0x0;
  (this->moduleRemap).max = 0;
  (this->moduleRemap).count = 0;
  (this->typeMap).nodePool.first = (StackChunk *)0x0;
  (this->typeMap).nodePool.curr = (StackChunk *)0x0;
  (this->typeMap).nodePool.size = 0xffc;
  (this->typeMap).freeList.allocator = (Allocator *)0x0;
  (this->typeMap).freeList.data = (this->typeMap).freeList.little;
  (this->typeMap).freeList.count = 0;
  (this->typeMap).freeList.max = 0x20;
  (this->typeMap).entries = (Node **)0x0;
  (this->typeMap).allocator = (Allocator *)0x0;
  (this->funcMap).nodePool.first = (StackChunk *)0x0;
  (this->funcMap).nodePool.curr = (StackChunk *)0x0;
  (this->funcMap).nodePool.size = 0xffc;
  (this->funcMap).allocator = (Allocator *)0x0;
  (this->funcMap).freeList.allocator = (Allocator *)0x0;
  (this->funcMap).freeList.data = (this->funcMap).freeList.little;
  (this->funcMap).freeList.max = 0x20;
  (this->funcMap).freeList.count = 0;
  (this->funcMap).entries = (Node **)0x0;
  (this->fullLinkerData).data = (uchar *)0x0;
  (this->fullLinkerData).max = 0;
  (this->fullLinkerData).count = 0;
  this->globalVarSize = 0;
  HashMap<unsigned_int>::init(&this->typeMap,ctx);
  HashMap<unsigned_int>::init(&this->funcMap,ctx);
  this->debugOutputIndent = 0;
  NULLC::SetLinker(this);
  return;
}

Assistant:

Linker::Linker(): exTypes(128), exTypeExtra(256), exTypeConstants(256), exVariables(128), exFunctions(256), exLocals(1024), exSymbols(8192), regVmJumpTargets(1024)
{
	globalVarSize = 0;

	typeMap.init();
	funcMap.init();

	debugOutputIndent = 0;

	NULLC::SetLinker(this);
}